

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<c___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,undefined8 *params_21,
          long params_22,long params_23,long params_24,long params_25,long params_26,long params_27,
          long params_28,long params_29,long params_30,long params_31,long params_32,
          undefined8 *params_33,long params_34,long params_35,long params_36,undefined8 *params_37,
          long params_38,long params_39,long params_40,long params_41,long params_42,long params_43,
          long params_44,long params_45,long params_46,long params_47,long params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,undefined8 *params_53,
          undefined8 *params_54,long params_55,long params_56,long params_57,long params_58,
          long params_59,long params_60,long params_61,long params_62,long params_63,long params_64,
          long params_65)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  undefined8 *in_stack_000001f8;
  long in_stack_00000200;
  undefined8 *in_stack_00000208;
  undefined8 *in_stack_00000210;
  undefined8 *in_stack_00000218;
  undefined8 *in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  long in_stack_00000240;
  long in_stack_00000248;
  long in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  undefined8 *in_stack_00000280;
  long in_stack_00000288;
  undefined8 *in_stack_00000290;
  undefined8 *in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  long in_stack_000002b0;
  long in_stack_000002b8;
  long in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  undefined8 *in_stack_000002f8;
  long in_stack_00000300;
  undefined8 *in_stack_00000308;
  undefined8 *in_stack_00000310;
  long in_stack_00000318;
  String local_3a8;
  size_t local_388 [105];
  StringTree *local_40;
  undefined8 *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_388[0] = this->size_;
  local_388[1] = *params;
  local_388[2] = *(undefined8 *)(params_1 + 8);
  local_388[3] = *(undefined8 *)(params_2 + 8);
  local_388[4] = *(undefined8 *)(params_3 + 8);
  local_388[5] = *(undefined8 *)(params_4 + 8);
  local_388[6] = *(undefined8 *)(params_5 + 8);
  local_388[7] = *(undefined8 *)(params_6 + 8);
  local_388[8] = *(undefined8 *)(params_7 + 8);
  local_388[9] = *params_8;
  local_388[10] = *(undefined8 *)(params_9 + 8);
  local_388[0xb] = *params_10;
  local_388[0xc] = *(undefined8 *)(params_11 + 8);
  local_388[0xd] = *(undefined8 *)(params_12 + 8);
  local_388[0xe] = *(undefined8 *)(params_13 + 8);
  local_388[0xf] = *(undefined8 *)(params_14 + 8);
  local_388[0x10] = *(undefined8 *)(params_15 + 8);
  local_388[0x11] = *(undefined8 *)(params_16 + 8);
  local_388[0x12] = *(undefined8 *)(params_17 + 8);
  local_388[0x13] = *params_18;
  local_388[0x14] = *(undefined8 *)(params_19 + 8);
  local_388[0x15] = *params_20;
  local_388[0x16] = *params_21;
  local_388[0x17] = *(undefined8 *)(params_22 + 8);
  local_388[0x18] = *(long *)(params_23 + 8) - 1;
  if (*(long *)(params_23 + 8) == 0) {
    local_388[0x18] = sVar3;
  }
  local_388[0x19] = *(undefined8 *)(params_24 + 8);
  local_388[0x1a] = *(undefined8 *)(params_25 + 8);
  local_388[0x1b] = *(undefined8 *)(params_26 + 8);
  local_388[0x1c] = *(undefined8 *)(params_27 + 8);
  local_388[0x1d] = *(undefined8 *)(params_28 + 8);
  local_388[0x1e] = *(undefined8 *)(params_29 + 8);
  local_388[0x1f] = *(undefined8 *)(params_30 + 8);
  local_388[0x20] = *(long *)(params_31 + 8) - 1;
  if (*(long *)(params_31 + 8) == 0) {
    local_388[0x20] = sVar3;
  }
  local_388[0x21] = *(undefined8 *)(params_32 + 8);
  local_388[0x22] = *params_33;
  local_388[0x23] = *(undefined8 *)(params_34 + 8);
  local_388[0x24] = *(undefined8 *)(params_35 + 8);
  local_388[0x25] = *(undefined8 *)(params_36 + 8);
  local_388[0x26] = *params_37;
  local_388[0x27] = *(undefined8 *)(params_38 + 8);
  local_388[0x28] = *(long *)(params_39 + 8) - 1;
  if (*(long *)(params_39 + 8) == 0) {
    local_388[0x28] = sVar3;
  }
  local_388[0x29] = *(undefined8 *)(params_40 + 8);
  local_388[0x2a] = *(undefined8 *)(params_41 + 8);
  local_388[0x2b] = *(undefined8 *)(params_42 + 8);
  local_388[0x2c] = *(undefined8 *)(params_43 + 8);
  local_388[0x2d] = *(undefined8 *)(params_44 + 8);
  local_388[0x2e] = *(undefined8 *)(params_45 + 8);
  local_388[0x2f] = *(undefined8 *)(params_46 + 8);
  local_388[0x30] = *(long *)(params_47 + 8) - 1;
  if (*(long *)(params_47 + 8) == 0) {
    local_388[0x30] = sVar3;
  }
  local_388[0x31] = *(undefined8 *)(params_48 + 8);
  local_388[0x32] = *params_49;
  local_388[0x33] = *(undefined8 *)(params_50 + 8);
  local_388[0x34] = *(undefined8 *)(params_51 + 8);
  local_388[0x35] = *(undefined8 *)(params_52 + 8);
  local_388[0x36] = *params_53;
  local_388[0x37] = *params_54;
  local_388[0x38] = *(undefined8 *)(params_55 + 8);
  local_388[0x39] = *(undefined8 *)(params_56 + 8);
  local_388[0x3a] = *(undefined8 *)(params_57 + 8);
  local_388[0x3b] = *(undefined8 *)(params_58 + 8);
  local_388[0x3c] = *(undefined8 *)(params_59 + 8);
  local_388[0x3d] = *(long *)(params_60 + 8) - 1;
  if (*(long *)(params_60 + 8) == 0) {
    local_388[0x3d] = sVar3;
  }
  local_388[0x3e] = *(undefined8 *)(params_61 + 8);
  local_388[0x3f] = *(undefined8 *)(params_62 + 8);
  local_388[0x40] = *(undefined8 *)(params_63 + 8);
  local_388[0x41] = *(long *)(params_64 + 8) - 1;
  if (*(long *)(params_64 + 8) == 0) {
    local_388[0x41] = sVar3;
  }
  local_388[0x42] = *(undefined8 *)(params_65 + 8);
  local_388[0x43] = *in_stack_000001f8;
  local_388[0x44] = *(undefined8 *)(in_stack_00000200 + 8);
  local_388[0x45] = *in_stack_00000208;
  local_388[0x46] = *in_stack_00000210;
  local_388[0x47] = *in_stack_00000218;
  local_388[0x48] = *in_stack_00000220;
  local_388[0x49] = *(undefined8 *)(in_stack_00000228 + 8);
  local_388[0x4a] = *(undefined8 *)(in_stack_00000230 + 8);
  local_388[0x4b] = *(undefined8 *)(in_stack_00000238 + 8);
  local_388[0x4c] = *(undefined8 *)(in_stack_00000240 + 8);
  local_388[0x4d] = *(undefined8 *)(in_stack_00000248 + 8);
  local_388[0x4e] = *(long *)(in_stack_00000250 + 8) - 1;
  if (*(long *)(in_stack_00000250 + 8) == 0) {
    local_388[0x4e] = sVar3;
  }
  local_388[0x4f] = *(undefined8 *)(in_stack_00000258 + 8);
  local_388[0x50] = *(undefined8 *)(in_stack_00000260 + 8);
  local_388[0x51] = *(undefined8 *)(in_stack_00000268 + 8);
  local_388[0x52] = *(long *)(in_stack_00000270 + 8) - 1;
  if (*(long *)(in_stack_00000270 + 8) == 0) {
    local_388[0x52] = sVar3;
  }
  local_388[0x53] = *(undefined8 *)(in_stack_00000278 + 8);
  local_388[0x54] = *in_stack_00000280;
  local_388[0x55] = *(undefined8 *)(in_stack_00000288 + 8);
  local_388[0x56] = *in_stack_00000290;
  local_388[0x57] = *in_stack_00000298;
  local_388[0x58] = *(undefined8 *)(in_stack_000002a0 + 8);
  local_388[0x59] = *(long *)(in_stack_000002a8 + 8) - 1;
  if (*(long *)(in_stack_000002a8 + 8) == 0) {
    local_388[0x59] = sVar3;
  }
  local_388[0x5a] = *(undefined8 *)(in_stack_000002b0 + 8);
  local_388[0x5b] = *(undefined8 *)(in_stack_000002b8 + 8);
  local_388[0x5c] = *(undefined8 *)(in_stack_000002c0 + 8);
  local_388[0x5d] = *(undefined8 *)(in_stack_000002c8 + 8);
  local_388[0x5e] = *(undefined8 *)(in_stack_000002d0 + 8);
  local_388[0x5f] = *(undefined8 *)(in_stack_000002d8 + 8);
  local_388[0x60] = *(undefined8 *)(in_stack_000002e0 + 8);
  local_388[0x61] = *(long *)(in_stack_000002e8 + 8) - 1;
  if (*(long *)(in_stack_000002e8 + 8) == 0) {
    local_388[0x61] = sVar3;
  }
  local_388[0x62] = *(undefined8 *)(in_stack_000002f0 + 8);
  local_388[99] = *in_stack_000002f8;
  local_388[100] = *(undefined8 *)(in_stack_00000300 + 8);
  local_388[0x65] = *in_stack_00000308;
  local_388[0x66] = *in_stack_00000310;
  local_388[0x67] = *(undefined8 *)(in_stack_00000318 + 8);
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_388 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x340);
  __return_storage_ptr__->size_ = sVar3;
  local_388[0] = 0;
  local_388[1] = 0;
  local_388[2] = *(undefined8 *)(params_1 + 8);
  local_388[3] = *(undefined8 *)(params_2 + 8);
  local_388[4] = *(undefined8 *)(params_3 + 8);
  local_388[5] = *(undefined8 *)(params_4 + 8);
  local_388[6] = *(undefined8 *)(params_5 + 8);
  local_388[7] = *(undefined8 *)(params_6 + 8);
  local_388[8] = *(undefined8 *)(params_7 + 8);
  local_388[9] = *params_8;
  local_388[10] = *(undefined8 *)(params_9 + 8);
  sVar3 = 0;
  local_388[0xb] = 0;
  local_388[0xc] = *(undefined8 *)(params_11 + 8);
  local_388[0xd] = *(undefined8 *)(params_12 + 8);
  local_388[0xe] = *(undefined8 *)(params_13 + 8);
  local_388[0xf] = *(undefined8 *)(params_14 + 8);
  local_388[0x10] = *(undefined8 *)(params_15 + 8);
  local_388[0x11] = *(undefined8 *)(params_16 + 8);
  local_388[0x12] = *(undefined8 *)(params_17 + 8);
  local_388[0x13] = *params_18;
  local_388[0x14] = *(undefined8 *)(params_19 + 8);
  local_388[0x15] = 0;
  local_388[0x16] = 0;
  local_388[0x17] = *(undefined8 *)(params_22 + 8);
  local_388[0x18] = 0;
  local_388[0x19] = *(undefined8 *)(params_24 + 8);
  local_388[0x1a] = *(undefined8 *)(params_25 + 8);
  local_388[0x1b] = *(undefined8 *)(params_26 + 8);
  local_388[0x1c] = *(undefined8 *)(params_27 + 8);
  local_388[0x1d] = *(undefined8 *)(params_28 + 8);
  local_388[0x1e] = *(undefined8 *)(params_29 + 8);
  local_388[0x1f] = *(undefined8 *)(params_30 + 8);
  local_388[0x20] = 0;
  local_388[0x21] = *(undefined8 *)(params_32 + 8);
  local_388[0x22] = *params_33;
  local_388[0x23] = *(undefined8 *)(params_34 + 8);
  local_388[0x24] = *(undefined8 *)(params_35 + 8);
  local_388[0x25] = *(undefined8 *)(params_36 + 8);
  local_388[0x26] = 0;
  local_388[0x27] = *(undefined8 *)(params_38 + 8);
  local_388[0x28] = 0;
  local_388[0x29] = *(undefined8 *)(params_40 + 8);
  local_388[0x2a] = *(undefined8 *)(params_41 + 8);
  local_388[0x2b] = *(undefined8 *)(params_42 + 8);
  local_388[0x2c] = *(undefined8 *)(params_43 + 8);
  local_388[0x2d] = *(undefined8 *)(params_44 + 8);
  local_388[0x2e] = *(undefined8 *)(params_45 + 8);
  local_388[0x2f] = *(undefined8 *)(params_46 + 8);
  local_388[0x30] = 0;
  local_388[0x31] = *(undefined8 *)(params_48 + 8);
  local_388[0x32] = *params_49;
  local_388[0x33] = *(undefined8 *)(params_50 + 8);
  local_388[0x34] = *(undefined8 *)(params_51 + 8);
  local_388[0x35] = *(undefined8 *)(params_52 + 8);
  local_388[0x36] = 0;
  local_388[0x37] = 0;
  local_388[0x38] = *(undefined8 *)(params_55 + 8);
  local_388[0x39] = *(undefined8 *)(params_56 + 8);
  local_388[0x3a] = *(undefined8 *)(params_57 + 8);
  local_388[0x3b] = *(undefined8 *)(params_58 + 8);
  local_388[0x3c] = *(undefined8 *)(params_59 + 8);
  local_388[0x3d] = 0;
  local_388[0x3e] = *(undefined8 *)(params_61 + 8);
  local_388[0x3f] = *(undefined8 *)(params_62 + 8);
  local_388[0x40] = *(undefined8 *)(params_63 + 8);
  local_388[0x41] = 0;
  local_388[0x42] = *(undefined8 *)(params_65 + 8);
  local_388[0x43] = *in_stack_000001f8;
  local_388[0x44] = *(undefined8 *)(in_stack_00000200 + 8);
  local_388[0x45] = 0;
  local_388[0x46] = 0;
  local_388[0x47] = 0;
  local_388[0x48] = 0;
  local_388[0x49] = *(undefined8 *)(in_stack_00000228 + 8);
  local_388[0x4a] = *(undefined8 *)(in_stack_00000230 + 8);
  local_388[0x4b] = *(undefined8 *)(in_stack_00000238 + 8);
  local_388[0x4c] = *(undefined8 *)(in_stack_00000240 + 8);
  local_388[0x4d] = *(undefined8 *)(in_stack_00000248 + 8);
  local_388[0x4e] = 0;
  local_388[0x4f] = *(undefined8 *)(in_stack_00000258 + 8);
  local_388[0x50] = *(undefined8 *)(in_stack_00000260 + 8);
  local_388[0x51] = *(undefined8 *)(in_stack_00000268 + 8);
  local_388[0x52] = 0;
  local_388[0x53] = *(undefined8 *)(in_stack_00000278 + 8);
  local_388[0x54] = *in_stack_00000280;
  local_388[0x55] = *(undefined8 *)(in_stack_00000288 + 8);
  local_388[0x56] = 0;
  local_388[0x57] = 0;
  local_388[0x58] = *(undefined8 *)(in_stack_000002a0 + 8);
  local_388[0x59] = 0;
  local_388[0x5a] = *(undefined8 *)(in_stack_000002b0 + 8);
  local_388[0x5b] = *(undefined8 *)(in_stack_000002b8 + 8);
  local_388[0x5c] = *(undefined8 *)(in_stack_000002c0 + 8);
  local_388[0x5d] = *(undefined8 *)(in_stack_000002c8 + 8);
  local_388[0x5e] = *(undefined8 *)(in_stack_000002d0 + 8);
  local_388[0x5f] = *(undefined8 *)(in_stack_000002d8 + 8);
  local_388[0x60] = *(undefined8 *)(in_stack_000002e0 + 8);
  local_388[0x61] = 0;
  local_388[0x62] = *(undefined8 *)(in_stack_000002f0 + 8);
  local_388[99] = *in_stack_000002f8;
  local_388[100] = *(undefined8 *)(in_stack_00000300 + 8);
  local_388[0x65] = 0;
  local_388[0x66] = 0;
  local_388[0x67] = *(undefined8 *)(in_stack_00000318 + 8);
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_388 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x340);
  local_40 = this;
  local_38 = params;
  heapString(&local_3a8,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_3a8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_3a8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_3a8.content.disposer;
  local_388[0] = 1;
  local_388[1] = 1;
  local_388[2] = 0;
  local_388[3] = 0;
  local_388[4] = 0;
  local_388[5] = 0;
  local_388[6] = 0;
  local_388[7] = 0;
  local_388[8] = 0;
  local_388[9] = 0;
  sVar3 = 0;
  local_388[10] = 0;
  local_388[0xb] = 1;
  local_388[0xc] = 0;
  local_388[0xd] = 0;
  local_388[0xe] = 0;
  local_388[0xf] = 0;
  local_388[0x10] = 0;
  local_388[0x11] = 0;
  local_388[0x12] = 0;
  local_388[0x13] = 0;
  local_388[0x14] = 0;
  local_388[0x15] = 1;
  local_388[0x16] = 1;
  local_388[0x17] = 0;
  local_388[0x18] = 1;
  local_388[0x19] = 0;
  local_388[0x1a] = 0;
  local_388[0x1b] = 0;
  local_388[0x1c] = 0;
  local_388[0x1d] = 0;
  local_388[0x1e] = 0;
  local_388[0x1f] = 0;
  local_388[0x20] = 1;
  local_388[0x25] = 0;
  local_388[0x23] = 0;
  local_388[0x24] = 0;
  local_388[0x21] = 0;
  local_388[0x22] = 0;
  local_388[0x26] = 1;
  local_388[0x27] = 0;
  local_388[0x28] = 1;
  local_388[0x29] = 0;
  local_388[0x2a] = 0;
  local_388[0x2b] = 0;
  local_388[0x2c] = 0;
  local_388[0x2d] = 0;
  local_388[0x2e] = 0;
  local_388[0x2f] = 0;
  local_388[0x30] = 1;
  local_388[0x35] = 0;
  local_388[0x33] = 0;
  local_388[0x34] = 0;
  local_388[0x31] = 0;
  local_388[0x32] = 0;
  local_388[0x36] = 1;
  local_388[0x37] = 1;
  local_388[0x3c] = 0;
  local_388[0x3a] = 0;
  local_388[0x3b] = 0;
  local_388[0x38] = 0;
  local_388[0x39] = 0;
  local_388[0x3d] = 1;
  local_388[0x40] = 0;
  local_388[0x3e] = 0;
  local_388[0x3f] = 0;
  local_388[0x41] = 1;
  local_388[0x44] = 0;
  local_388[0x42] = 0;
  local_388[0x43] = 0;
  local_388[0x45] = 1;
  local_388[0x46] = 1;
  local_388[0x47] = 1;
  local_388[0x48] = 1;
  local_388[0x4d] = 0;
  local_388[0x4b] = 0;
  local_388[0x4c] = 0;
  local_388[0x49] = 0;
  local_388[0x4a] = 0;
  local_388[0x4e] = 1;
  local_388[0x51] = 0;
  local_388[0x4f] = 0;
  local_388[0x50] = 0;
  local_388[0x52] = 1;
  local_388[0x55] = 0;
  local_388[0x53] = 0;
  local_388[0x54] = 0;
  local_388[0x56] = 1;
  local_388[0x57] = 1;
  local_388[0x58] = 0;
  local_388[0x59] = 1;
  local_388[0x60] = 0;
  local_388[0x5e] = 0;
  local_388[0x5f] = 0;
  local_388[0x5c] = 0;
  local_388[0x5d] = 0;
  local_388[0x5a] = 0;
  local_388[0x5b] = 0;
  local_388[0x61] = 1;
  local_388[100] = 0;
  local_388[0x62] = 0;
  local_388[99] = 0;
  local_388[0x65] = 1;
  local_388[0x66] = 1;
  local_388[0x67] = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_388 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x340);
  local_3a8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_3a8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_3a8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_3a8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_3a8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_3a8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::Ar___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,local_40,local_38,params_1,params_2,params_3,params_4,
             params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}